

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSliderConstraint.cpp
# Opt level: O2

void __thiscall
btSliderConstraint::getInfo2NonVirtual
          (btSliderConstraint *this,btConstraintInfo2 *info,btTransform *transA,btTransform *transB,
          btVector3 *linVelA,btVector3 *linVelB,btScalar rbAinvMass,btScalar rbBinvMass)

{
  btVector3 *v1;
  btRigidBody *pbVar1;
  btRigidBody *pbVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [12];
  btConstraintInfo2 *pbVar8;
  btConstraintInfo2 *pbVar9;
  btScalar abVar10 [4];
  btScalar *pbVar11;
  btScalar *pbVar12;
  long lVar13;
  btScalar *pbVar14;
  int iVar15;
  int iVar16;
  btScalar *pbVar17;
  long lVar18;
  byte bVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  float fVar23;
  btScalar bVar24;
  undefined4 in_XMM0_Db;
  float fVar25;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  btScalar bVar26;
  btScalar bVar27;
  float in_XMM1_Db;
  float in_XMM1_Dc;
  undefined4 uVar28;
  float in_XMM1_Dd;
  undefined4 uVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  btVector3 bVar38;
  btVector3 local_238;
  btVector3 local_228;
  btVector3 local_218;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  float local_1ec;
  undefined8 local_1e8;
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  btScalar local_198 [4];
  btScalar local_188 [4];
  btScalar local_178 [4];
  undefined1 local_168 [16];
  btVector3 local_158;
  uint local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  btVector3 local_138;
  undefined1 local_128 [16];
  undefined8 local_118;
  float fStack_110;
  float fStack_10c;
  btVector3 local_108;
  btVector3 *local_f8;
  btVector3 *local_f0;
  undefined1 local_e8 [16];
  btVector3 ax1B;
  btVector3 ax1A;
  btTransform bodyB_trans;
  btTransform bodyA_trans;
  
  local_208._4_4_ = in_XMM0_Db;
  local_208._0_4_ = rbAinvMass;
  fStack_200 = (float)in_XMM0_Dc;
  fStack_1fc = (float)in_XMM0_Dd;
  iVar16 = info->rowskip;
  local_1ec = 1.0;
  if (this->m_useLinearReferenceFrameA == false) {
    local_1ec = -1.0;
  }
  v1 = &(this->m_calculatedTransformB).m_origin;
  local_118 = &(this->m_calculatedTransformA).m_origin;
  local_168._8_8_ = local_168._0_8_;
  local_168._0_8_ = v1;
  fStack_1e0 = in_XMM1_Dc;
  fStack_1dc = in_XMM1_Dd;
  local_f8 = linVelA;
  local_f0 = linVelB;
  local_1e8._0_4_ = rbBinvMass;
  local_1e8._4_4_ = in_XMM1_Db;
  bVar38 = operator-(v1,local_118);
  local_1c8._8_4_ = extraout_XMM0_Dc;
  local_1c8._0_8_ = bVar38.m_floats._0_8_;
  local_1c8._12_4_ = extraout_XMM0_Dd;
  local_1a8._8_4_ = in_XMM1_Dc;
  local_1a8._0_8_ = bVar38.m_floats._8_8_;
  local_1a8._12_4_ = in_XMM1_Dd;
  local_148 = -(uint)((btScalar)local_1e8 < 1.1920929e-07);
  bVar3 = local_1e8._4_4_ < 0.0;
  uVar21 = -(uint)((float)local_208._0_4_ < 1.1920929e-07);
  bVar4 = (float)local_208._4_4_ < 0.0;
  bVar5 = fStack_200 < 0.0;
  bVar6 = fStack_1fc < 0.0;
  uVar22 = -(uint)(0.0 < (float)local_208._0_4_ + (btScalar)local_1e8);
  fVar32 = (float)(~uVar22 & 0x3f000000 |
                  (uint)((btScalar)local_1e8 / ((float)local_208._0_4_ + (btScalar)local_1e8)) &
                  uVar22);
  fVar36 = 1.0 - fVar32;
  fVar30 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[0];
  fVar23 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[0];
  bVar24 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[0];
  ax1A.m_floats[1] = fVar23;
  ax1A.m_floats[0] = fVar30;
  ax1A.m_floats[2] = bVar24;
  ax1A.m_floats[3] = 0.0;
  fVar31 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[0];
  fVar25 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[0];
  ax1B.m_floats[1] = fVar25;
  ax1B.m_floats[0] = fVar31;
  ax1B.m_floats[2] = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[0];
  ax1B.m_floats[3] = 0.0;
  _local_208 = ZEXT416((uint)fVar36);
  local_1d8 = ZEXT416((uint)fVar32);
  local_1e8 = info;
  if (this->m_useOffsetForConstraintFrame == true) {
    local_238.m_floats[1] = fVar25 * fVar36 + fVar23 * fVar32;
    local_238.m_floats[0] = fVar31 * fVar36 + fVar30 * fVar32;
    local_238.m_floats[2] =
         (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[0] * fVar36 +
         (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[0] * fVar32;
    local_238.m_floats[3] = 0.0;
    local_1b8._4_4_ = -(uint)bVar4;
    local_1b8._0_4_ = uVar21;
    fStack_1b0 = (float)-(uint)bVar5;
    fStack_1ac = (float)-(uint)bVar6;
    iStack_144 = -(uint)bVar3;
    iStack_140 = -(uint)(fStack_1e0 < 0.0);
    iStack_13c = -(uint)(fStack_1dc < 0.0);
    btVector3::normalize(&local_238);
    btPlaneSpace1<btVector3>(&local_238,&local_228,&local_218);
    bVar24 = local_228.m_floats[0];
    uVar21 = local_1b8._0_4_;
  }
  else {
    local_238.m_floats[1] = fVar23;
    local_238.m_floats[0] = fVar30;
    local_238.m_floats[2] = bVar24;
    local_238.m_floats[3] = 0.0;
    bVar24 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[1];
    local_228.m_floats[1] = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[1];
    local_228.m_floats[0] = bVar24;
    local_228.m_floats[2] = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[1];
    local_228.m_floats[3] = 0.0;
    local_218.m_floats[1] = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[2];
    local_218.m_floats[0] =
         (btScalar)(int)*(undefined8 *)((this->m_calculatedTransformA).m_basis.m_el[0].m_floats + 2)
    ;
    local_218.m_floats[2] = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[2];
    local_218.m_floats[3] = 0.0;
  }
  pbVar8 = local_1e8;
  local_148 = uVar21 | local_148;
  pbVar11 = local_1e8->m_J1angularAxis;
  *pbVar11 = bVar24;
  pbVar11[1] = local_228.m_floats[1];
  pbVar11[2] = local_228.m_floats[2];
  pbVar11[iVar16] = local_218.m_floats[0];
  pbVar11[(long)iVar16 + 1] = local_218.m_floats[1];
  pbVar11[(long)iVar16 + 2] = local_218.m_floats[2];
  uVar28 = 0x80000000;
  uVar29 = 0x80000000;
  pbVar11 = local_1e8->m_J2angularAxis;
  *pbVar11 = -local_228.m_floats[0];
  pbVar11[1] = -local_228.m_floats[1];
  pbVar11[2] = -local_228.m_floats[2];
  pbVar11[iVar16] = -local_218.m_floats[0];
  pbVar11[(long)iVar16 + 1] = -local_218.m_floats[1];
  pbVar11[(long)iVar16 + 2] = -local_218.m_floats[2];
  fVar23 = this->m_softnessOrthoAng;
  if ((this->m_flags & 0x80) == 0) {
    fVar23 = fVar23 * local_1e8->erp;
  }
  local_1b8._0_4_ = fVar23 * local_1e8->fps;
  bVar38 = btVector3::cross(&ax1A,&ax1B);
  pbVar11 = pbVar8->m_constraintError;
  *pbVar11 = (local_228.m_floats[2] * bVar38.m_floats[2] +
             local_228.m_floats[0] * bVar38.m_floats[0] + local_228.m_floats[1] * bVar38.m_floats[1]
             ) * (float)local_1b8._0_4_;
  pbVar11[iVar16] =
       (bVar38.m_floats[2] * local_218.m_floats[2] +
       local_218.m_floats[0] * bVar38.m_floats[0] + bVar38.m_floats[1] * local_218.m_floats[1]) *
       (float)local_1b8._0_4_;
  if ((this->m_flags & 0x40) != 0) {
    bVar24 = this->m_cfmOrthoAng;
    pbVar11 = pbVar8->cfm;
    *pbVar11 = bVar24;
    pbVar11[iVar16] = bVar24;
  }
  bodyA_trans.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(transA->m_basis).m_el[0].m_floats;
  bodyA_trans.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((transA->m_basis).m_el[0].m_floats + 2);
  bodyA_trans.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(transA->m_basis).m_el[1].m_floats;
  bodyA_trans.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((transA->m_basis).m_el[1].m_floats + 2);
  bodyA_trans.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(transA->m_basis).m_el[2].m_floats;
  bodyA_trans.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((transA->m_basis).m_el[2].m_floats + 2);
  bodyA_trans.m_origin.m_floats._0_8_ = *(undefined8 *)(transA->m_origin).m_floats;
  bodyA_trans.m_origin.m_floats._8_8_ = *(undefined8 *)((transA->m_origin).m_floats + 2);
  bodyB_trans.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(transB->m_basis).m_el[0].m_floats;
  bodyB_trans.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((transB->m_basis).m_el[0].m_floats + 2);
  bodyB_trans.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(transB->m_basis).m_el[1].m_floats;
  bodyB_trans.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((transB->m_basis).m_el[1].m_floats + 2);
  bodyB_trans.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(transB->m_basis).m_el[2].m_floats;
  bodyB_trans.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((transB->m_basis).m_el[2].m_floats + 2);
  bodyB_trans.m_origin.m_floats._0_8_ = *(undefined8 *)(transB->m_origin).m_floats;
  bodyB_trans.m_origin.m_floats._8_8_ = *(undefined8 *)((transB->m_origin).m_floats + 2);
  local_188 = (btScalar  [4])ZEXT816(0);
  local_198 = (btScalar  [4])ZEXT816(0);
  local_138.m_floats = (btScalar  [4])ZEXT816(0);
  local_158.m_floats = (btScalar  [4])ZEXT816(0);
  local_108.m_floats = (btScalar  [4])ZEXT816(0);
  lVar18 = (long)(iVar16 * 2);
  lVar20 = (long)(iVar16 * 3);
  if (this->m_useOffsetForConstraintFrame == true) {
    local_158 = operator-((btVector3 *)local_168._0_8_,&bodyB_trans.m_origin);
    bVar38.m_floats = local_238.m_floats;
    local_e8._8_4_ = extraout_XMM0_Dc_00;
    local_e8._0_8_ = local_158.m_floats._0_8_;
    local_e8._12_4_ = extraout_XMM0_Dd_00;
    local_168._8_4_ = uVar28;
    local_168._0_8_ = local_158.m_floats._8_8_;
    local_168._12_4_ = uVar29;
    local_128._8_8_ = 0;
    local_128._0_4_ = local_238.m_floats[0];
    local_128._4_4_ = local_238.m_floats[1];
    local_238.m_floats[2] = bVar38.m_floats[2];
    _local_1b8 = ZEXT416((uint)local_238.m_floats[2]);
    local_238.m_floats = bVar38.m_floats;
    bVar38 = operator-(local_118,&bodyA_trans.m_origin);
    fVar30 = this->m_linPos - (this->m_depth).m_floats[0];
    fVar33 = local_238.m_floats[0];
    fVar35 = local_238.m_floats[1];
    fVar32 = bVar38.m_floats[2] * local_238.m_floats[2] +
             fVar33 * bVar38.m_floats[0] + fVar35 * bVar38.m_floats[1];
    fVar34 = (float)local_168._0_4_ * (float)local_1b8._0_4_ +
             (float)local_128._0_4_ * (float)local_e8._0_4_ +
             (float)local_128._4_4_ * (float)local_e8._4_4_;
    fVar31 = bVar38.m_floats[2] - local_238.m_floats[2] * fVar32;
    fVar36 = (fVar30 * local_238.m_floats[2] + local_238.m_floats[2] * fVar32) -
             (float)local_1b8._0_4_ * fVar34;
    fVar37 = (float)local_168._0_4_ - (float)local_1b8._0_4_ * fVar34;
    fVar23 = bVar38.m_floats[0] - fVar32 * fVar33;
    fVar25 = bVar38.m_floats[1] - fVar32 * fVar35;
    fVar33 = (fVar32 * fVar33 + fVar30 * fVar33) - fVar34 * (float)local_128._0_4_;
    fVar30 = (fVar32 * fVar35 + fVar30 * fVar35) - fVar34 * (float)local_128._4_4_;
    local_138.m_floats[1] = (float)local_1d8._0_4_ * fVar30 + fVar25;
    local_138.m_floats[0] = (float)local_1d8._0_4_ * fVar33 + fVar23;
    local_138.m_floats[2] = (float)local_1d8._0_4_ * fVar36 + fVar31;
    local_138.m_floats[3] = 0.0;
    fVar32 = (float)local_e8._0_4_ - fVar34 * (float)local_128._0_4_;
    fVar34 = (float)local_e8._4_4_ - fVar34 * (float)local_128._4_4_;
    local_1b8._4_4_ = local_1d8._0_4_;
    local_1b8._0_4_ = local_1d8._0_4_;
    fStack_1b0 = (float)local_1d8._0_4_;
    fStack_1ac = (float)local_1d8._0_4_;
    local_158.m_floats[1] = fVar34 - fVar30 * (float)local_208._0_4_;
    local_158.m_floats[0] = fVar32 - fVar33 * (float)local_208._0_4_;
    local_158.m_floats[2] = fVar37 - fVar36 * (float)local_208._0_4_;
    local_158.m_floats[3] = 0.0;
    local_118 = (btVector3 *)CONCAT44(local_208._0_4_,local_208._0_4_);
    fStack_110 = (float)local_208._0_4_;
    fStack_10c = (float)local_208._0_4_;
    local_228.m_floats[1] = fVar25 * (float)local_208._0_4_ + (float)local_1d8._0_4_ * fVar34;
    local_228.m_floats[0] = fVar23 * (float)local_208._0_4_ + (float)local_1d8._0_4_ * fVar32;
    local_228.m_floats[2] = fVar31 * (float)local_208._0_4_ + (float)local_1d8._0_4_ * fVar37;
    local_228.m_floats[3] = 0.0;
    bVar24 = btVector3::length2(&local_228);
    if (bVar24 <= 1.1920929e-07) {
      local_228.m_floats[1] = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[1];
      local_228.m_floats[0] =
           (btScalar)
           (int)*(undefined8 *)((this->m_calculatedTransformA).m_basis.m_el[0].m_floats + 1);
      local_228.m_floats[2] = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[1];
      local_228.m_floats[3] = 0.0;
    }
    else {
      if (bVar24 < 0.0) {
        fVar23 = sqrtf(bVar24);
      }
      else {
        fVar23 = SQRT(bVar24);
      }
      local_178[0] = fVar23;
      btVector3::operator/=(&local_228,local_178);
    }
    local_218 = btVector3::cross(&local_238,&local_228);
    local_188 = (btScalar  [4])btVector3::cross(&local_138,&local_228);
    bVar38 = btVector3::cross(&local_158,&local_228);
    local_198[0] = bVar38.m_floats[0];
    local_198[1] = bVar38.m_floats[1];
    local_198[2] = bVar38.m_floats[2];
    local_198[3] = bVar38.m_floats[3];
    pbVar11 = pbVar8->m_J1angularAxis;
    uVar28 = 0x80000000;
    uVar29 = 0x80000000;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar11[lVar18 + lVar13] = local_188[lVar13];
    }
    pbVar11 = pbVar8->m_J2angularAxis;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar11[lVar18 + lVar13] = -local_198[lVar13];
    }
    local_188 = (btScalar  [4])btVector3::cross(&local_138,&local_218);
    local_128._8_4_ = extraout_XMM0_Dc_01;
    local_128._0_8_ = local_188._0_8_;
    local_128._12_4_ = extraout_XMM0_Dd_01;
    local_168._8_4_ = uVar28;
    local_168._0_8_ = local_188._8_8_;
    local_168._12_4_ = uVar29;
    bVar38 = btVector3::cross(&local_158,&local_218);
    abVar10 = local_188;
    local_198[0] = bVar38.m_floats[0];
    local_198[1] = bVar38.m_floats[1];
    local_198[2] = bVar38.m_floats[2];
    local_198[3] = bVar38.m_floats[3];
    if (((local_148 & 1) != 0) && (this->m_solveAngLim == true)) {
      local_198[1] = local_118._4_4_ * bVar38.m_floats[1];
      local_198[0] = (float)local_118 * bVar38.m_floats[0];
      local_198[3] = bVar38.m_floats[3];
      local_198[2] = bVar38.m_floats[2] * (float)local_208._0_4_;
      local_188[1] = (float)local_1b8._4_4_ * (float)local_128._4_4_;
      local_188[0] = (float)local_1b8._0_4_ * (float)local_128._0_4_;
      local_188[3] = abVar10[3];
      local_188[2] = (float)local_168._0_4_ * (float)local_1d8._0_4_;
    }
    pbVar11 = pbVar8->m_J1angularAxis;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar11[lVar20 + lVar13] = local_188[lVar13];
    }
    pbVar11 = pbVar8->m_J2angularAxis;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar11[lVar20 + lVar13] = -local_198[lVar13];
    }
    pbVar11 = pbVar8->m_J1linearAxis;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar11[lVar18 + lVar13] = local_228.m_floats[lVar13];
    }
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar11[lVar20 + lVar13] = local_218.m_floats[lVar13];
    }
    pbVar14 = pbVar8->m_J2linearAxis;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar14[lVar18 + lVar13] = -local_228.m_floats[lVar13];
    }
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar14[lVar20 + lVar13] = -local_218.m_floats[lVar13];
    }
  }
  else {
    local_108.m_floats[1] = bodyB_trans.m_origin.m_floats[1] - bodyA_trans.m_origin.m_floats[1];
    local_108.m_floats[0] = bodyB_trans.m_origin.m_floats[0] - bodyA_trans.m_origin.m_floats[0];
    local_108.m_floats[2] = bodyB_trans.m_origin.m_floats[2] - bodyA_trans.m_origin.m_floats[2];
    local_108.m_floats[3] = 0.0;
    bVar38 = btVector3::cross(&local_108,&local_228);
    local_178[0] = bVar38.m_floats[0];
    local_178[1] = bVar38.m_floats[1];
    local_178[2] = bVar38.m_floats[2];
    local_178[3] = bVar38.m_floats[3];
    pbVar11 = pbVar8->m_J1angularAxis;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar11[lVar18 + lVar13] = local_178[lVar13] * (float)local_1d8._0_4_;
    }
    pbVar11 = pbVar8->m_J2angularAxis;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar11[lVar18 + lVar13] = local_178[lVar13] * (float)local_208._0_4_;
    }
    bVar38 = btVector3::cross(&local_108,&local_218);
    local_178[0] = bVar38.m_floats[0];
    local_178[1] = bVar38.m_floats[1];
    local_178[2] = bVar38.m_floats[2];
    local_178[3] = bVar38.m_floats[3];
    pbVar11 = pbVar8->m_J1angularAxis;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar11[lVar20 + lVar13] = local_178[lVar13] * (float)local_1d8._0_4_;
    }
    pbVar11 = pbVar8->m_J2angularAxis;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar11[lVar20 + lVar13] = local_178[lVar13] * (float)local_208._0_4_;
    }
    pbVar11 = pbVar8->m_J1linearAxis;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar11[lVar18 + lVar13] = local_228.m_floats[lVar13];
    }
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar11[lVar20 + lVar13] = local_218.m_floats[lVar13];
    }
    pbVar14 = pbVar8->m_J2linearAxis;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar14[lVar18 + lVar13] = -local_228.m_floats[lVar13];
    }
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pbVar14[lVar20 + lVar13] = -local_218.m_floats[lVar13];
    }
  }
  pbVar9 = local_1e8;
  uVar21 = this->m_flags;
  fVar23 = this->m_softnessOrthoLin;
  if ((uVar21 & 0x20) == 0) {
    fVar23 = fVar23 * pbVar8->erp;
  }
  fVar23 = fVar23 * pbVar8->fps;
  fVar25 = (float)local_1c8._4_4_;
  pbVar12 = pbVar8->m_constraintError;
  pbVar12[lVar18] =
       (local_228.m_floats[2] * (float)local_1a8._0_4_ +
       local_228.m_floats[0] * (float)local_1c8._0_4_ +
       local_228.m_floats[1] * (float)local_1c8._4_4_) * fVar23;
  pbVar12[lVar20] =
       ((float)local_1a8._0_4_ * local_218.m_floats[2] +
       local_218.m_floats[0] * (float)local_1c8._0_4_ +
       (float)local_1c8._4_4_ * local_218.m_floats[1]) * fVar23;
  if ((uVar21 & 0x10) != 0) {
    bVar24 = this->m_cfmOrthoLin;
    pbVar17 = pbVar8->cfm;
    pbVar17[lVar18] = bVar24;
    pbVar17[lVar20] = bVar24;
  }
  bVar19 = this->m_solveLinLim;
  bVar3 = this->m_poweredLinMotor;
  if ((bVar3 | bVar19) == 1) {
    local_1c8[0] = bVar19;
    local_1a8._0_4_ = (this->m_depth).m_floats[0] * local_1ec;
    lVar18 = (long)local_1e8->rowskip;
    iVar16 = local_1e8->rowskip * 4;
    pbVar11[lVar18 * 4] = local_238.m_floats[0];
    iVar15 = iVar16 + 1;
    pbVar11[iVar15] = local_238.m_floats[1];
    iVar16 = iVar16 + 2;
    pbVar11[iVar16] = local_238.m_floats[2];
    pbVar14[lVar18 * 4] = -local_238.m_floats[0];
    pbVar14[iVar15] = -local_238.m_floats[1];
    pbVar14[iVar16] = -local_238.m_floats[2];
    if (this->m_useOffsetForConstraintFrame == true) {
      if ((local_148 & 1) == 0) {
        fVar23 = fVar25;
        local_188 = (btScalar  [4])btVector3::cross(&local_138,&local_238);
        local_1d8._8_4_ = extraout_XMM0_Dc_02;
        local_1d8._0_8_ = local_188._0_8_;
        local_1d8._12_4_ = extraout_XMM0_Dd_02;
        fStack_200 = fVar25;
        local_208 = (undefined1  [8])local_188._8_8_;
        fStack_1fc = fVar23;
        local_198 = (btScalar  [4])btVector3::cross(&local_158,&local_238);
        pbVar11 = local_1e8->m_J1angularAxis;
        pbVar11[lVar18 * 4] = (btScalar)local_1d8._0_4_;
        pbVar11[iVar15] = (btScalar)local_1d8._4_4_;
        pbVar11[iVar16] = (btScalar)local_208._0_4_;
        pbVar11 = local_1e8->m_J2angularAxis;
        *(ulong *)(pbVar11 + lVar18 * 4) = local_198._0_8_ ^ 0x8000000080000000;
        bVar24 = -local_198[2];
        goto LAB_0017d7bf;
      }
    }
    else {
      bVar38 = btVector3::cross(&local_108,&local_238);
      pbVar11 = pbVar9->m_J1angularAxis;
      *(ulong *)(pbVar11 + lVar18 * 4) =
           CONCAT44((float)local_1d8._0_4_ * bVar38.m_floats[1],
                    (float)local_1d8._0_4_ * bVar38.m_floats[0]);
      pbVar11[iVar16] = (float)local_1d8._0_4_ * bVar38.m_floats[2];
      pbVar11 = pbVar9->m_J2angularAxis;
      *(ulong *)(pbVar11 + lVar18 * 4) =
           CONCAT44((float)local_208._0_4_ * bVar38.m_floats[1],
                    (float)local_208._0_4_ * bVar38.m_floats[0]);
      bVar24 = (float)local_208._0_4_ * bVar38.m_floats[2];
      bVar19 = local_1c8[0];
LAB_0017d7bf:
      pbVar11[iVar16] = bVar24;
    }
    pbVar8 = local_1e8;
    fVar23 = this->m_lowerLinLimit;
    fVar25 = this->m_upperLinLimit;
    pbVar12 = local_1e8->m_constraintError;
    pbVar12[lVar18 * 4] = 0.0;
    pbVar11 = local_1e8->m_lowerLimit;
    pbVar11[lVar18 * 4] = 0.0;
    pbVar14 = local_1e8->m_upperLimit;
    pbVar14[lVar18 * 4] = 0.0;
    pbVar17 = &local_1e8->erp;
    if (((uint)this->m_flags >> 9 & 1) != 0) {
      pbVar17 = &this->m_softnessLimLin;
    }
    fVar30 = *pbVar17;
    local_208._0_4_ = fVar30;
    if ((bVar3 != false) && ((fVar23 == fVar25 & bVar19) == 0)) {
      local_1c8._0_4_ = fVar25;
      local_1d8._0_4_ = fVar23;
      if ((this->m_flags & 1U) != 0) {
        local_1e8->cfm[lVar18 * 4] = this->m_cfmDirLin;
      }
      bVar24 = btTypedConstraint::getMotorFactor
                         (&this->super_btTypedConstraint,this->m_linPos,this->m_lowerLinLimit,
                          this->m_upperLinLimit,this->m_targetLinMotorVelocity,
                          local_1e8->fps * fVar30);
      pbVar12 = pbVar8->m_constraintError;
      pbVar12[lVar18 * 4] =
           pbVar12[lVar18 * 4] - bVar24 * local_1ec * this->m_targetLinMotorVelocity;
      pbVar11 = pbVar8->m_lowerLimit;
      pbVar11[lVar18 * 4] = pbVar11[lVar18 * 4] - this->m_maxLinMotorForce / pbVar8->fps;
      pbVar14 = pbVar8->m_upperLimit;
      pbVar14[lVar18 * 4] = this->m_maxLinMotorForce / pbVar8->fps + pbVar14[lVar18 * 4];
      fVar23 = (float)local_1d8._0_4_;
      fVar25 = (float)local_1c8._0_4_;
    }
    uVar21 = 5;
    if (bVar19 != 0) {
      pbVar12[lVar18 * 4] =
           (float)local_208._0_4_ * pbVar8->fps * (float)local_1a8._0_4_ + pbVar12[lVar18 * 4];
      if ((this->m_flags & 0x100) != 0) {
        pbVar8->cfm[lVar18 * 4] = this->m_cfmLimLin;
      }
      if ((fVar23 != fVar25) || (NAN(fVar23) || NAN(fVar25))) {
        bVar24 = 0.0;
        bVar26 = (btScalar)(-(uint)((float)local_1a8._0_4_ <= 0.0) & 0xff7fffff);
        if (0.0 < (float)local_1a8._0_4_) {
          bVar24 = 3.4028235e+38;
        }
      }
      else {
        bVar24 = 3.4028235e+38;
        bVar26 = -3.4028235e+38;
      }
      pbVar11[lVar18 * 4] = bVar26;
      pbVar14[lVar18 * 4] = bVar24;
      fVar23 = 1.0 - this->m_dampingLimLin;
      if (fVar23 == 0.0) {
        fVar25 = pbVar12[lVar18 * 4];
      }
      else {
        fVar23 = ABS(fVar23);
        fVar30 = local_1ec *
                 ((local_f8->m_floats[2] * local_238.m_floats[2] +
                  local_f8->m_floats[0] * local_238.m_floats[0] +
                  local_f8->m_floats[1] * local_238.m_floats[1]) -
                 (local_238.m_floats[2] * local_f0->m_floats[2] +
                 local_238.m_floats[0] * local_f0->m_floats[0] +
                 local_238.m_floats[1] * local_f0->m_floats[1]));
        fVar25 = pbVar12[lVar18 * 4];
        if (0.0 < (float)local_1a8._0_4_) {
          if ((0.0 < fVar30) && (fVar30 = fVar30 * -fVar23, fVar30 < fVar25)) goto LAB_0017da89;
        }
        else if ((fVar30 < 0.0) && (fVar30 = fVar30 * -fVar23, fVar25 < fVar30)) {
LAB_0017da89:
          fVar25 = fVar30;
          pbVar12[lVar18 * 4] = fVar25;
        }
      }
      pbVar12[lVar18 * 4] = fVar25 * this->m_softnessLimLin;
    }
  }
  else {
    uVar21 = 4;
  }
  pbVar8 = local_1e8;
  auVar7 = (undefined1  [12])local_238.m_floats._0_12_;
  bVar3 = this->m_solveAngLim;
  bVar4 = this->m_poweredAngMotor;
  if ((bVar4 | bVar3) != 1) {
    return;
  }
  bVar24 = this->m_angDepth;
  lVar20 = (ulong)uVar21 * (long)local_1e8->rowskip;
  pbVar11 = local_1e8->m_J1angularAxis;
  pbVar11[lVar20] = local_238.m_floats[0];
  lVar18 = (long)(int)lVar20;
  pbVar11[lVar18 + 1] = local_238.m_floats[1];
  pbVar11[lVar18 + 2] = local_238.m_floats[2];
  pbVar11 = local_1e8->m_J2angularAxis;
  pbVar11[lVar20] = -local_238.m_floats[0];
  pbVar11[lVar18 + 1] = -local_238.m_floats[1];
  pbVar11[lVar18 + 2] = -local_238.m_floats[2];
  fVar23 = this->m_lowerAngLimit;
  fVar25 = this->m_upperAngLimit;
  pbVar11 = &local_1e8->erp;
  if (((uint)this->m_flags >> 0xb & 1) != 0) {
    pbVar11 = &this->m_softnessLimAng;
  }
  fVar30 = *pbVar11;
  local_208._0_4_ = fVar30;
  local_238.m_floats._0_12_ = auVar7;
  if ((bVar4 != false) && ((fVar23 == fVar25 & bVar3) == 0)) {
    local_1d8._0_4_ = bVar24;
    local_1c8._0_4_ = fVar25;
    local_1a8._0_4_ = fVar23;
    if ((this->m_flags & 4U) != 0) {
      local_1e8->cfm[lVar20] = this->m_cfmDirAng;
      fVar23 = this->m_lowerAngLimit;
      fVar25 = this->m_upperAngLimit;
    }
    bVar24 = btTypedConstraint::getMotorFactor
                       (&this->super_btTypedConstraint,this->m_angPos,fVar23,fVar25,
                        this->m_targetAngMotorVelocity,local_1e8->fps * fVar30);
    pbVar12 = pbVar8->m_constraintError;
    pbVar12[lVar20] = bVar24 * this->m_targetAngMotorVelocity;
    pbVar8->m_lowerLimit[lVar20] = -this->m_maxAngMotorForce / pbVar8->fps;
    pbVar8->m_upperLimit[lVar20] = this->m_maxAngMotorForce / pbVar8->fps;
    fVar23 = (float)local_1a8._0_4_;
    fVar25 = (float)local_1c8._0_4_;
    bVar24 = (btScalar)local_1d8._0_4_;
  }
  if (bVar3 == false) {
    return;
  }
  pbVar12[lVar20] = (float)local_208._0_4_ * local_1e8->fps * bVar24 + pbVar12[lVar20];
  if ((this->m_flags & 0x400) != 0) {
    local_1e8->cfm[lVar20] = this->m_cfmLimAng;
  }
  if ((fVar23 != fVar25) || (NAN(fVar23) || NAN(fVar25))) {
    bVar26 = 0.0;
    bVar27 = (btScalar)(~-(uint)(0.0 < bVar24) & 0xff7fffff);
    if (0.0 < bVar24) {
      bVar26 = 3.4028235e+38;
    }
  }
  else {
    bVar26 = 3.4028235e+38;
    bVar27 = -3.4028235e+38;
  }
  local_1e8->m_lowerLimit[lVar20] = bVar27;
  local_1e8->m_upperLimit[lVar20] = bVar26;
  fVar23 = 1.0 - this->m_dampingLimAng;
  if (fVar23 == 0.0) {
    fVar25 = pbVar12[lVar20];
  }
  else {
    fVar23 = ABS(fVar23);
    pbVar1 = (this->super_btTypedConstraint).m_rbA;
    pbVar2 = (this->super_btTypedConstraint).m_rbB;
    fVar30 = ((pbVar1->m_angularVelocity).m_floats[2] * local_238.m_floats[2] +
             (pbVar1->m_angularVelocity).m_floats[0] * local_238.m_floats[0] +
             (pbVar1->m_angularVelocity).m_floats[1] * local_238.m_floats[1]) -
             (local_238.m_floats[2] * (pbVar2->m_angularVelocity).m_floats[2] +
             local_238.m_floats[0] * (pbVar2->m_angularVelocity).m_floats[0] +
             local_238.m_floats[1] * (pbVar2->m_angularVelocity).m_floats[1]);
    fVar25 = pbVar12[lVar20];
    if (bVar24 <= 0.0) {
      if ((fVar30 <= 0.0) || (bVar24 = fVar30 * -fVar23, fVar25 <= bVar24)) goto LAB_0017ddb3;
    }
    else if ((0.0 <= fVar30) || (bVar24 = fVar30 * -fVar23, bVar24 <= fVar25)) goto LAB_0017ddb3;
    pbVar12[lVar20] = bVar24;
    fVar25 = bVar24;
  }
LAB_0017ddb3:
  pbVar12[lVar20] = fVar25 * this->m_softnessLimAng;
  return;
}

Assistant:

void btSliderConstraint::getInfo2NonVirtual(btConstraintInfo2* info, const btTransform& transA,const btTransform& transB, const btVector3& linVelA,const btVector3& linVelB, btScalar rbAinvMass,btScalar rbBinvMass  )
{
	const btTransform& trA = getCalculatedTransformA();
	const btTransform& trB = getCalculatedTransformB();
	
	btAssert(!m_useSolveConstraintObsolete);
	int i, s = info->rowskip;
	
	btScalar signFact = m_useLinearReferenceFrameA ? btScalar(1.0f) : btScalar(-1.0f);
	
	// difference between frames in WCS
	btVector3 ofs = trB.getOrigin() - trA.getOrigin();
	// now get weight factors depending on masses
	btScalar miA = rbAinvMass;
	btScalar miB = rbBinvMass;
	bool hasStaticBody = (miA < SIMD_EPSILON) || (miB < SIMD_EPSILON);
	btScalar miS = miA + miB;
	btScalar factA, factB;
	if(miS > btScalar(0.f))
	{
		factA = miB / miS;
	}
	else 
	{
		factA = btScalar(0.5f);
	}
	factB = btScalar(1.0f) - factA;
	btVector3 ax1, p, q;
	btVector3 ax1A = trA.getBasis().getColumn(0);
	btVector3 ax1B = trB.getBasis().getColumn(0);
	if(m_useOffsetForConstraintFrame)
	{
		// get the desired direction of slider axis
		// as weighted sum of X-orthos of frameA and frameB in WCS
		ax1 = ax1A * factA + ax1B * factB;
		ax1.normalize();
		// construct two orthos to slider axis
		btPlaneSpace1 (ax1, p, q);
	}
	else
	{ // old way - use frameA
		ax1 = trA.getBasis().getColumn(0);
		// get 2 orthos to slider axis (Y, Z)
		p = trA.getBasis().getColumn(1);
		q = trA.getBasis().getColumn(2);
	}
	// make rotations around these orthos equal
	// the slider axis should be the only unconstrained
	// rotational axis, the angular velocity of the two bodies perpendicular to
	// the slider axis should be equal. thus the constraint equations are
	//    p*w1 - p*w2 = 0
	//    q*w1 - q*w2 = 0
	// where p and q are unit vectors normal to the slider axis, and w1 and w2
	// are the angular velocity vectors of the two bodies.
	info->m_J1angularAxis[0] = p[0];
	info->m_J1angularAxis[1] = p[1];
	info->m_J1angularAxis[2] = p[2];
	info->m_J1angularAxis[s+0] = q[0];
	info->m_J1angularAxis[s+1] = q[1];
	info->m_J1angularAxis[s+2] = q[2];

	info->m_J2angularAxis[0] = -p[0];
	info->m_J2angularAxis[1] = -p[1];
	info->m_J2angularAxis[2] = -p[2];
	info->m_J2angularAxis[s+0] = -q[0];
	info->m_J2angularAxis[s+1] = -q[1];
	info->m_J2angularAxis[s+2] = -q[2];
	// compute the right hand side of the constraint equation. set relative
	// body velocities along p and q to bring the slider back into alignment.
	// if ax1A,ax1B are the unit length slider axes as computed from bodyA and
	// bodyB, we need to rotate both bodies along the axis u = (ax1 x ax2).
	// if "theta" is the angle between ax1 and ax2, we need an angular velocity
	// along u to cover angle erp*theta in one step :
	//   |angular_velocity| = angle/time = erp*theta / stepsize
	//                      = (erp*fps) * theta
	//    angular_velocity  = |angular_velocity| * (ax1 x ax2) / |ax1 x ax2|
	//                      = (erp*fps) * theta * (ax1 x ax2) / sin(theta)
	// ...as ax1 and ax2 are unit length. if theta is smallish,
	// theta ~= sin(theta), so
	//    angular_velocity  = (erp*fps) * (ax1 x ax2)
	// ax1 x ax2 is in the plane space of ax1, so we project the angular
	// velocity to p and q to find the right hand side.
//	btScalar k = info->fps * info->erp * getSoftnessOrthoAng();
	btScalar currERP = (m_flags & BT_SLIDER_FLAGS_ERP_ORTANG) ? m_softnessOrthoAng : m_softnessOrthoAng * info->erp;
	btScalar k = info->fps * currERP;

	btVector3 u = ax1A.cross(ax1B);
	info->m_constraintError[0] = k * u.dot(p);
	info->m_constraintError[s] = k * u.dot(q);
	if(m_flags & BT_SLIDER_FLAGS_CFM_ORTANG)
	{
		info->cfm[0] = m_cfmOrthoAng;
		info->cfm[s] = m_cfmOrthoAng;
	}

	int nrow = 1; // last filled row
	int srow;
	btScalar limit_err;
	int limit;
	int powered;

	// next two rows. 
	// we want: velA + wA x relA == velB + wB x relB ... but this would
	// result in three equations, so we project along two orthos to the slider axis

	btTransform bodyA_trans = transA;
	btTransform bodyB_trans = transB;
	nrow++;
	int s2 = nrow * s;
	nrow++;
	int s3 = nrow * s;
	btVector3 tmpA(0,0,0), tmpB(0,0,0), relA(0,0,0), relB(0,0,0), c(0,0,0);
	if(m_useOffsetForConstraintFrame)
	{
		// get vector from bodyB to frameB in WCS
		relB = trB.getOrigin() - bodyB_trans.getOrigin();
		// get its projection to slider axis
		btVector3 projB = ax1 * relB.dot(ax1);
		// get vector directed from bodyB to slider axis (and orthogonal to it)
		btVector3 orthoB = relB - projB;
		// same for bodyA
		relA = trA.getOrigin() - bodyA_trans.getOrigin();
		btVector3 projA = ax1 * relA.dot(ax1);
		btVector3 orthoA = relA - projA;
		// get desired offset between frames A and B along slider axis
		btScalar sliderOffs = m_linPos - m_depth[0];
		// desired vector from projection of center of bodyA to projection of center of bodyB to slider axis
		btVector3 totalDist = projA + ax1 * sliderOffs - projB;
		// get offset vectors relA and relB
		relA = orthoA + totalDist * factA;
		relB = orthoB - totalDist * factB;
		// now choose average ortho to slider axis
		p = orthoB * factA + orthoA * factB;
		btScalar len2 = p.length2();
		if(len2 > SIMD_EPSILON)
		{
			p /= btSqrt(len2);
		}
		else
		{
			p = trA.getBasis().getColumn(1);
		}
		// make one more ortho
		q = ax1.cross(p);
		// fill two rows
		tmpA = relA.cross(p);
		tmpB = relB.cross(p);
		for (i=0; i<3; i++) info->m_J1angularAxis[s2+i] = tmpA[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[s2+i] = -tmpB[i];
		tmpA = relA.cross(q);
		tmpB = relB.cross(q);
		if(hasStaticBody && getSolveAngLimit())
		{ // to make constraint between static and dynamic objects more rigid
			// remove wA (or wB) from equation if angular limit is hit
			tmpB *= factB;
			tmpA *= factA;
		}
		for (i=0; i<3; i++) info->m_J1angularAxis[s3+i] = tmpA[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[s3+i] = -tmpB[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s2+i] = p[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s3+i] = q[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s2+i] = -p[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s3+i] = -q[i];
	}
	else
	{	// old way - maybe incorrect if bodies are not on the slider axis
		// see discussion "Bug in slider constraint" http://bulletphysics.org/Bullet/phpBB3/viewtopic.php?f=9&t=4024&start=0
		c = bodyB_trans.getOrigin() - bodyA_trans.getOrigin();
		btVector3 tmp = c.cross(p);
		for (i=0; i<3; i++) info->m_J1angularAxis[s2+i] = factA*tmp[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[s2+i] = factB*tmp[i];
		tmp = c.cross(q);
		for (i=0; i<3; i++) info->m_J1angularAxis[s3+i] = factA*tmp[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[s3+i] = factB*tmp[i];

		for (i=0; i<3; i++) info->m_J1linearAxis[s2+i] = p[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s3+i] = q[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s2+i] = -p[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s3+i] = -q[i];
	}
	// compute two elements of right hand side

	//	k = info->fps * info->erp * getSoftnessOrthoLin();
	currERP = (m_flags & BT_SLIDER_FLAGS_ERP_ORTLIN) ? m_softnessOrthoLin : m_softnessOrthoLin * info->erp;
	k = info->fps * currERP;

	btScalar rhs = k * p.dot(ofs);
	info->m_constraintError[s2] = rhs;
	rhs = k * q.dot(ofs);
	info->m_constraintError[s3] = rhs;
	if(m_flags & BT_SLIDER_FLAGS_CFM_ORTLIN)
	{
		info->cfm[s2] = m_cfmOrthoLin;
		info->cfm[s3] = m_cfmOrthoLin;
	}


	// check linear limits
	limit_err = btScalar(0.0);
	limit = 0;
	if(getSolveLinLimit())
	{
		limit_err = getLinDepth() *  signFact;
		limit = (limit_err > btScalar(0.0)) ? 2 : 1;
	}
	powered = 0;
	if(getPoweredLinMotor())
	{
		powered = 1;
	}
	// if the slider has joint limits or motor, add in the extra row
	if (limit || powered) 
	{
		nrow++;
		srow = nrow * info->rowskip;
		info->m_J1linearAxis[srow+0] = ax1[0];
		info->m_J1linearAxis[srow+1] = ax1[1];
		info->m_J1linearAxis[srow+2] = ax1[2];
		info->m_J2linearAxis[srow+0] = -ax1[0];
		info->m_J2linearAxis[srow+1] = -ax1[1];
		info->m_J2linearAxis[srow+2] = -ax1[2];
		// linear torque decoupling step:
		//
		// we have to be careful that the linear constraint forces (+/- ax1) applied to the two bodies
		// do not create a torque couple. in other words, the points that the
		// constraint force is applied at must lie along the same ax1 axis.
		// a torque couple will result in limited slider-jointed free
		// bodies from gaining angular momentum.
		if(m_useOffsetForConstraintFrame)
		{
			// this is needed only when bodyA and bodyB are both dynamic.
			if(!hasStaticBody)
			{
				tmpA = relA.cross(ax1);
				tmpB = relB.cross(ax1);
				info->m_J1angularAxis[srow+0] = tmpA[0];
				info->m_J1angularAxis[srow+1] = tmpA[1];
				info->m_J1angularAxis[srow+2] = tmpA[2];
				info->m_J2angularAxis[srow+0] = -tmpB[0];
				info->m_J2angularAxis[srow+1] = -tmpB[1];
				info->m_J2angularAxis[srow+2] = -tmpB[2];
			}
		}
		else
		{ // The old way. May be incorrect if bodies are not on the slider axis
			btVector3 ltd;	// Linear Torque Decoupling vector (a torque)
			ltd = c.cross(ax1);
			info->m_J1angularAxis[srow+0] = factA*ltd[0];
			info->m_J1angularAxis[srow+1] = factA*ltd[1];
			info->m_J1angularAxis[srow+2] = factA*ltd[2];
			info->m_J2angularAxis[srow+0] = factB*ltd[0];
			info->m_J2angularAxis[srow+1] = factB*ltd[1];
			info->m_J2angularAxis[srow+2] = factB*ltd[2];
		}
		// right-hand part
		btScalar lostop = getLowerLinLimit();
		btScalar histop = getUpperLinLimit();
		if(limit && (lostop == histop))
		{  // the joint motor is ineffective
			powered = 0;
		}
		info->m_constraintError[srow] = 0.;
		info->m_lowerLimit[srow] = 0.;
		info->m_upperLimit[srow] = 0.;
		currERP = (m_flags & BT_SLIDER_FLAGS_ERP_LIMLIN) ? m_softnessLimLin : info->erp;
		if(powered)
		{
			if(m_flags & BT_SLIDER_FLAGS_CFM_DIRLIN)
			{
				info->cfm[srow] = m_cfmDirLin;
			}
			btScalar tag_vel = getTargetLinMotorVelocity();
			btScalar mot_fact = getMotorFactor(m_linPos, m_lowerLinLimit, m_upperLinLimit, tag_vel, info->fps * currERP);
			info->m_constraintError[srow] -= signFact * mot_fact * getTargetLinMotorVelocity();
			info->m_lowerLimit[srow] += -getMaxLinMotorForce() / info->fps;
			info->m_upperLimit[srow] += getMaxLinMotorForce() / info->fps;
		}
		if(limit)
		{
			k = info->fps * currERP;
			info->m_constraintError[srow] += k * limit_err;
			if(m_flags & BT_SLIDER_FLAGS_CFM_LIMLIN)
			{
				info->cfm[srow] = m_cfmLimLin;
			}
			if(lostop == histop) 
			{	// limited low and high simultaneously
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else if(limit == 1) 
			{ // low limit
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = 0;
			}
			else 
			{ // high limit
				info->m_lowerLimit[srow] = 0;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			// bounce (we'll use slider parameter abs(1.0 - m_dampingLimLin) for that)
			btScalar bounce = btFabs(btScalar(1.0) - getDampingLimLin());
			if(bounce > btScalar(0.0))
			{
				btScalar vel = linVelA.dot(ax1);
				vel -= linVelB.dot(ax1);
				vel *= signFact;
				// only apply bounce if the velocity is incoming, and if the
				// resulting c[] exceeds what we already have.
				if(limit == 1)
				{	// low limit
					if(vel < 0)
					{
						btScalar newc = -bounce * vel;
						if (newc > info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
				else
				{ // high limit - all those computations are reversed
					if(vel > 0)
					{
						btScalar newc = -bounce * vel;
						if(newc < info->m_constraintError[srow]) 
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
			}
			info->m_constraintError[srow] *= getSoftnessLimLin();
		} // if(limit)
	} // if linear limit
	// check angular limits
	limit_err = btScalar(0.0);
	limit = 0;
	if(getSolveAngLimit())
	{
		limit_err = getAngDepth();
		limit = (limit_err > btScalar(0.0)) ? 1 : 2;
	}
	// if the slider has joint limits, add in the extra row
	powered = 0;
	if(getPoweredAngMotor())
	{
		powered = 1;
	}
	if(limit || powered) 
	{
		nrow++;
		srow = nrow * info->rowskip;
		info->m_J1angularAxis[srow+0] = ax1[0];
		info->m_J1angularAxis[srow+1] = ax1[1];
		info->m_J1angularAxis[srow+2] = ax1[2];

		info->m_J2angularAxis[srow+0] = -ax1[0];
		info->m_J2angularAxis[srow+1] = -ax1[1];
		info->m_J2angularAxis[srow+2] = -ax1[2];

		btScalar lostop = getLowerAngLimit();
		btScalar histop = getUpperAngLimit();
		if(limit && (lostop == histop))
		{  // the joint motor is ineffective
			powered = 0;
		}
		currERP = (m_flags & BT_SLIDER_FLAGS_ERP_LIMANG) ? m_softnessLimAng : info->erp;
		if(powered)
		{
			if(m_flags & BT_SLIDER_FLAGS_CFM_DIRANG)
			{
				info->cfm[srow] = m_cfmDirAng;
			}
			btScalar mot_fact = getMotorFactor(m_angPos, m_lowerAngLimit, m_upperAngLimit, getTargetAngMotorVelocity(), info->fps * currERP);
			info->m_constraintError[srow] = mot_fact * getTargetAngMotorVelocity();
			info->m_lowerLimit[srow] = -getMaxAngMotorForce() / info->fps;
			info->m_upperLimit[srow] = getMaxAngMotorForce() / info->fps;
		}
		if(limit)
		{
			k = info->fps * currERP;
			info->m_constraintError[srow] += k * limit_err;
			if(m_flags & BT_SLIDER_FLAGS_CFM_LIMANG)
			{
				info->cfm[srow] = m_cfmLimAng;
			}
			if(lostop == histop) 
			{
				// limited low and high simultaneously
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else if(limit == 1) 
			{ // low limit
				info->m_lowerLimit[srow] = 0;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else 
			{ // high limit
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = 0;
			}
			// bounce (we'll use slider parameter abs(1.0 - m_dampingLimAng) for that)
			btScalar bounce = btFabs(btScalar(1.0) - getDampingLimAng());
			if(bounce > btScalar(0.0))
			{
				btScalar vel = m_rbA.getAngularVelocity().dot(ax1);
				vel -= m_rbB.getAngularVelocity().dot(ax1);
				// only apply bounce if the velocity is incoming, and if the
				// resulting c[] exceeds what we already have.
				if(limit == 1)
				{	// low limit
					if(vel < 0)
					{
						btScalar newc = -bounce * vel;
						if(newc > info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
				else
				{	// high limit - all those computations are reversed
					if(vel > 0)
					{
						btScalar newc = -bounce * vel;
						if(newc < info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
			}
			info->m_constraintError[srow] *= getSoftnessLimAng();
		} // if(limit)
	} // if angular limit or powered
}